

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

CURLMcode singlesocket(Curl_multi *multi,Curl_easy *data)

{
  int *piVar1;
  byte bVar2;
  int iVar3;
  curl_socket_callback p_Var4;
  Curl_easy *pCVar5;
  uint uVar6;
  Curl_hash *pCVar7;
  void *pvVar8;
  ulong uVar9;
  long lVar10;
  size_t key_len;
  ulong uVar11;
  Curl_easy **key;
  ulong __n;
  uint uVar12;
  int iVar13;
  byte bVar14;
  Curl_multi *pCVar15;
  bool bVar16;
  uchar actions [5];
  curl_socket_t socks [5];
  undefined1 local_74 [4];
  Curl_easy *local_70;
  Curl_hash *local_68;
  Curl_multi *local_60;
  int local_54;
  byte local_4d [5];
  curl_socket_t local_48 [6];
  
  local_48[0] = -1;
  local_48[1] = 0xffffffff;
  local_48[2] = 0xffffffff;
  local_48[3] = 0xffffffff;
  local_48[4] = 0xffffffff;
  local_70 = data;
  local_60 = multi;
  uVar6 = multi_getsock(data,local_48);
  local_68 = &multi->sockhash;
  uVar11 = 0;
  do {
    bVar14 = (byte)uVar11;
    uVar12 = 0x10000 << (bVar14 & 0x1f);
    if ((uVar6 >> (bVar14 & 0x1f) & 0x10001) == 0) goto LAB_001310a1;
    iVar3 = local_48[uVar11];
    local_74 = (undefined1  [4])iVar3;
    if (iVar3 == -1) {
      pCVar7 = (Curl_hash *)0x0;
    }
    else {
      pCVar7 = (Curl_hash *)Curl_hash_pick(local_68,local_74,4);
    }
    bVar16 = (1 << (bVar14 & 0x1f) & uVar6) != 0;
    bVar14 = bVar16 + 2;
    if ((uVar12 & uVar6) == 0) {
      bVar14 = bVar16;
    }
    local_4d[uVar11] = bVar14;
    if (pCVar7 == (Curl_hash *)0x0) {
      local_74 = (undefined1  [4])iVar3;
      local_54 = iVar3;
      if ((iVar3 == -1) ||
         (pCVar7 = (Curl_hash *)Curl_hash_pick(local_68,local_74,4), pCVar7 == (Curl_hash *)0x0)) {
        pCVar7 = (Curl_hash *)(*Curl_ccalloc)(1,0x48);
        if (pCVar7 == (Curl_hash *)0x0) {
          return CURLM_OUT_OF_MEMORY;
        }
        iVar13 = Curl_hash_init(pCVar7,0xd,trhash,trhash_compare,trhash_dtor);
        if (iVar13 != 0) {
LAB_001311d6:
          (*Curl_cfree)(pCVar7);
          return CURLM_OUT_OF_MEMORY;
        }
        pvVar8 = Curl_hash_add(local_68,&local_54,4,pCVar7);
        if (pvVar8 == (void *)0x0) {
          Curl_hash_destroy(pCVar7);
          goto LAB_001311d6;
        }
      }
    }
    else if (0 < (long)local_70->numsocks) {
      lVar10 = 0;
      do {
        if (iVar3 == local_70->sockets[lVar10]) {
          bVar2 = local_70->actions[lVar10];
          bVar16 = true;
          pCVar15 = local_60;
          if (bVar2 != bVar14) {
            if ((bVar2 & 1) != 0) {
              *(int *)&pCVar7[1].comp_func = *(int *)&pCVar7[1].comp_func + -1;
            }
            if ((bVar2 & 2) != 0) {
              piVar1 = (int *)((long)&pCVar7[1].comp_func + 4);
              *piVar1 = *piVar1 + -1;
            }
            if ((bVar14 & 1) != 0) {
              *(int *)&pCVar7[1].comp_func = *(int *)&pCVar7[1].comp_func + 1;
            }
            if ((uVar12 & uVar6) != 0) {
              piVar1 = (int *)((long)&pCVar7[1].comp_func + 4);
              *piVar1 = *piVar1 + 1;
            }
          }
          goto LAB_00131000;
        }
        lVar10 = lVar10 + 1;
      } while (local_70->numsocks != lVar10);
    }
    pCVar15 = local_60;
    piVar1 = (int *)((long)&pCVar7[1].table + 4);
    *piVar1 = *piVar1 + 1;
    if ((bVar14 & 1) != 0) {
      *(int *)&pCVar7[1].comp_func = *(int *)&pCVar7[1].comp_func + 1;
    }
    if ((uVar12 & uVar6) != 0) {
      piVar1 = (int *)((long)&pCVar7[1].comp_func + 4);
      *piVar1 = *piVar1 + 1;
    }
    pvVar8 = Curl_hash_add(pCVar7,&local_70,8,local_70);
    if (pvVar8 == (void *)0x0) {
      return CURLM_OUT_OF_MEMORY;
    }
    bVar16 = false;
LAB_00131000:
    iVar13 = (uint)(*(int *)&pCVar7[1].comp_func != 0) +
             (uint)(*(int *)((long)&pCVar7[1].comp_func + 4) != 0) * 2;
    if ((!bVar16) || (*(int *)&pCVar7[1].table != iVar13)) {
      if (pCVar15->socket_cb != (curl_socket_callback)0x0) {
        (*pCVar15->socket_cb)(local_70,iVar3,iVar13,pCVar15->socket_userp,pCVar7[1].hash_func);
      }
      *(int *)&pCVar7[1].table = iVar13;
    }
    uVar11 = uVar11 + 1;
  } while (uVar11 != 5);
  uVar11 = 5;
LAB_001310a1:
  __n = uVar11 & 0xffffffff;
  if (0 < local_70->numsocks) {
    lVar10 = 0;
    do {
      pCVar15 = local_60;
      iVar3 = local_70->sockets[lVar10];
      if ((int)uVar11 != 0) {
        uVar9 = 0;
        do {
          if (iVar3 == local_48[uVar9]) goto LAB_0013117e;
          uVar9 = uVar9 + 1;
        } while (__n != uVar9);
      }
      local_74 = (undefined1  [4])iVar3;
      if ((iVar3 != -1) &&
         (pCVar7 = (Curl_hash *)Curl_hash_pick(local_68,local_74,4), pCVar7 != (Curl_hash *)0x0)) {
        bVar14 = local_70->actions[lVar10];
        iVar13 = *(int *)((long)&pCVar7[1].table + 4) + -1;
        *(int *)((long)&pCVar7[1].table + 4) = iVar13;
        if ((bVar14 & 2) != 0) {
          piVar1 = (int *)((long)&pCVar7[1].comp_func + 4);
          *piVar1 = *piVar1 + -1;
        }
        if ((bVar14 & 1) != 0) {
          *(int *)&pCVar7[1].comp_func = *(int *)&pCVar7[1].comp_func + -1;
        }
        if (iVar13 == 0) {
          p_Var4 = pCVar15->socket_cb;
          if (p_Var4 != (curl_socket_callback)0x0) {
            (*p_Var4)(local_70,iVar3,4,pCVar15->socket_userp,pCVar7[1].hash_func);
          }
          local_74 = (undefined1  [4])iVar3;
          Curl_hash_destroy(pCVar7);
          key_len = 4;
          key = (Curl_easy **)local_74;
          pCVar7 = local_68;
        }
        else {
          key_len = 8;
          key = &local_70;
        }
        Curl_hash_delete(pCVar7,key,key_len);
      }
LAB_0013117e:
      lVar10 = lVar10 + 1;
    } while (lVar10 < local_70->numsocks);
  }
  pCVar5 = local_70;
  memcpy(local_70->sockets,local_48,__n * 4);
  memcpy(pCVar5->actions,local_4d,__n);
  pCVar5->numsocks = (int)uVar11;
  return CURLM_OK;
}

Assistant:

static CURLMcode singlesocket(struct Curl_multi *multi,
                              struct Curl_easy *data)
{
  curl_socket_t socks[MAX_SOCKSPEREASYHANDLE];
  int i;
  struct Curl_sh_entry *entry;
  curl_socket_t s;
  int num;
  unsigned int curraction;
  unsigned char actions[MAX_SOCKSPEREASYHANDLE];

  for(i = 0; i< MAX_SOCKSPEREASYHANDLE; i++)
    socks[i] = CURL_SOCKET_BAD;

  /* Fill in the 'current' struct with the state as it is now: what sockets to
     supervise and for what actions */
  curraction = multi_getsock(data, socks);

  /* We have 0 .. N sockets already and we get to know about the 0 .. M
     sockets we should have from now on. Detect the differences, remove no
     longer supervised ones and add new ones */

  /* walk over the sockets we got right now */
  for(i = 0; (i< MAX_SOCKSPEREASYHANDLE) &&
        (curraction & (GETSOCK_READSOCK(i) | GETSOCK_WRITESOCK(i)));
      i++) {
    unsigned char action = CURL_POLL_NONE;
    unsigned char prevaction = 0;
    int comboaction;
    bool sincebefore = FALSE;

    s = socks[i];

    /* get it from the hash */
    entry = sh_getentry(&multi->sockhash, s);

    if(curraction & GETSOCK_READSOCK(i))
      action |= CURL_POLL_IN;
    if(curraction & GETSOCK_WRITESOCK(i))
      action |= CURL_POLL_OUT;

    actions[i] = action;
    if(entry) {
      /* check if new for this transfer */
      int j;
      for(j = 0; j< data->numsocks; j++) {
        if(s == data->sockets[j]) {
          prevaction = data->actions[j];
          sincebefore = TRUE;
          break;
        }
      }
    }
    else {
      /* this is a socket we didn't have before, add it to the hash! */
      entry = sh_addentry(&multi->sockhash, s);
      if(!entry)
        /* fatal */
        return CURLM_OUT_OF_MEMORY;
    }
    if(sincebefore && (prevaction != action)) {
      /* Socket was used already, but different action now */
      if(prevaction & CURL_POLL_IN)
        entry->readers--;
      if(prevaction & CURL_POLL_OUT)
        entry->writers--;
      if(action & CURL_POLL_IN)
        entry->readers++;
      if(action & CURL_POLL_OUT)
        entry->writers++;
    }
    else if(!sincebefore) {
      /* a new user */
      entry->users++;
      if(action & CURL_POLL_IN)
        entry->readers++;
      if(action & CURL_POLL_OUT)
        entry->writers++;

      /* add 'data' to the transfer hash on this socket! */
      if(!Curl_hash_add(&entry->transfers, (char *)&data, /* hash key */
                        sizeof(struct Curl_easy *), data))
        return CURLM_OUT_OF_MEMORY;
    }

    comboaction = (entry->writers? CURL_POLL_OUT : 0) |
                   (entry->readers ? CURL_POLL_IN : 0);

    /* socket existed before and has the same action set as before */
    if(sincebefore && ((int)entry->action == comboaction))
      /* same, continue */
      continue;

    if(multi->socket_cb)
      multi->socket_cb(data, s, comboaction, multi->socket_userp,
                       entry->socketp);

    entry->action = comboaction; /* store the current action state */
  }

  num = i; /* number of sockets */

  /* when we've walked over all the sockets we should have right now, we must
     make sure to detect sockets that are removed */
  for(i = 0; i< data->numsocks; i++) {
    int j;
    bool stillused = FALSE;
    s = data->sockets[i];
    for(j = 0; j < num; j++) {
      if(s == socks[j]) {
        /* this is still supervised */
        stillused = TRUE;
        break;
      }
    }
    if(stillused)
      continue;

    entry = sh_getentry(&multi->sockhash, s);
    /* if this is NULL here, the socket has been closed and notified so
       already by Curl_multi_closed() */
    if(entry) {
      unsigned char oldactions = data->actions[i];
      /* this socket has been removed. Decrease user count */
      entry->users--;
      if(oldactions & CURL_POLL_OUT)
        entry->writers--;
      if(oldactions & CURL_POLL_IN)
        entry->readers--;
      if(!entry->users) {
        if(multi->socket_cb)
          multi->socket_cb(data, s, CURL_POLL_REMOVE,
                           multi->socket_userp,
                           entry->socketp);
        sh_delentry(entry, &multi->sockhash, s);
      }
      else {
        /* still users, but remove this handle as a user of this socket */
        if(Curl_hash_delete(&entry->transfers, (char *)&data,
                            sizeof(struct Curl_easy *))) {
          DEBUGASSERT(NULL);
        }
      }
    }
  } /* for loop over numsocks */

  memcpy(data->sockets, socks, num*sizeof(curl_socket_t));
  memcpy(data->actions, actions, num*sizeof(char));
  data->numsocks = num;
  return CURLM_OK;
}